

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_53533::ParserImpl::ParseExpList(ParserImpl *this)

{
  TokenDetail *pTVar1;
  __uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true> in_RDI;
  bool anymore;
  unique_ptr<luna::ExpressionList,_std::default_delete<luna::ExpressionList>_> exp_list;
  int in_stack_0000012c;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_00000130;
  ParserImpl *in_stack_00000138;
  undefined1 in_stack_00000150 [32];
  pointer in_stack_ffffffffffffff48;
  anon_union_8_2_010d16d7_for_TokenDetail_0 __x;
  ParserImpl *in_stack_ffffffffffffff50;
  unique_ptr<luna::ExpressionList,_std::default_delete<luna::ExpressionList>_>
  *in_stack_ffffffffffffff58;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_ffffffffffffff60;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_58;
  ParserImpl *pPStack_50;
  unique_ptr<luna::ExpressionList,_std::default_delete<luna::ExpressionList>_> *local_48;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *puStack_40;
  byte local_25;
  
  operator_new(0x28);
  LookAhead(in_stack_ffffffffffffff50);
  luna::ExpressionList::ExpressionList
            ((ExpressionList *)in_stack_ffffffffffffff50,
             (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
  std::unique_ptr<luna::ExpressionList,std::default_delete<luna::ExpressionList>>::
  unique_ptr<std::default_delete<luna::ExpressionList>,void>
            ((unique_ptr<luna::ExpressionList,_std::default_delete<luna::ExpressionList>_> *)
             in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  local_25 = 1;
  while ((local_25 & 1) != 0) {
    std::unique_ptr<luna::ExpressionList,_std::default_delete<luna::ExpressionList>_>::operator->
              ((unique_ptr<luna::ExpressionList,_std::default_delete<luna::ExpressionList>_> *)
               0x183d9a);
    std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::
    unique_ptr<std::default_delete<luna::SyntaxTree>,void>
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
               in_stack_ffffffffffffff50);
    luna::TokenDetail::TokenDetail((TokenDetail *)&local_58);
    __x = local_58;
    in_stack_ffffffffffffff50 = pPStack_50;
    in_stack_ffffffffffffff58 = local_48;
    in_stack_ffffffffffffff60 = puStack_40;
    ParseExp(in_stack_00000138,in_stack_00000130,(TokenDetail)in_stack_00000150,in_stack_0000012c);
    std::
    vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
    ::push_back((vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
                 *)in_stack_ffffffffffffff50,(value_type *)__x.str_);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
              (in_stack_ffffffffffffff60);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
              (in_stack_ffffffffffffff60);
    pTVar1 = LookAhead(in_stack_ffffffffffffff50);
    if (pTVar1->token_ == 0x2c) {
      NextToken(in_stack_ffffffffffffff50);
    }
    else {
      local_25 = 0;
    }
  }
  std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::
  unique_ptr<luna::ExpressionList,std::default_delete<luna::ExpressionList>,void>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::unique_ptr<luna::ExpressionList,_std::default_delete<luna::ExpressionList>_>::~unique_ptr
            ((unique_ptr<luna::ExpressionList,_std::default_delete<luna::ExpressionList>_> *)
             in_stack_ffffffffffffff50);
  return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
         (tuple<luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>)
         in_RDI.super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t
         .super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
         super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<SyntaxTree> ParseExpList()
        {
            std::unique_ptr<ExpressionList> exp_list(new ExpressionList(LookAhead().line_));

            bool anymore = true;
            while (anymore)
            {
                exp_list->exp_list_.push_back(ParseExp());

                if (LookAhead().token_ == ',')
                    NextToken();
                else
                    anymore = false;
            }

            return std::move(exp_list);
        }